

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netpong.cpp
# Opt level: O1

int main(void)

{
  Am_Slot_Key AVar1;
  Am_Slot_Key AVar2;
  ushort uVar3;
  ushort uVar4;
  Am_Wrapper *pAVar5;
  Am_Object *pAVar6;
  Am_Object AVar7;
  Am_Value_List *pAVar8;
  undefined8 uVar9;
  Am_Constraint *pAVar10;
  Am_Object AVar11;
  Am_Object AVar12;
  Am_Object AVar13;
  Am_Font bigfont;
  Am_Object paddle_proto;
  Am_Object start_button_proto;
  Am_Object ball_proto;
  Am_Object local_220 [2];
  Am_Object local_210 [2];
  Am_Object local_200 [2];
  Am_Font local_1f0 [8];
  Am_Object local_1e8;
  Am_String local_1e0 [8];
  Am_Object local_1d8;
  Am_String local_1d0 [8];
  Am_Object local_1c8;
  Am_String local_1c0 [8];
  Am_Object local_1b8;
  Am_String local_1b0 [8];
  Am_Object local_1a8;
  Am_String local_1a0 [8];
  Am_Object local_198;
  Am_Object local_190;
  Am_Object local_188;
  Am_Object local_180;
  Am_Object local_178;
  Am_Object local_170;
  Am_Object local_168;
  Am_Object local_160;
  Am_Object local_158;
  Am_Object local_150;
  Am_Object local_148;
  Am_Object local_140;
  Am_Object local_138;
  Am_Object local_130;
  Am_Object local_128;
  Am_Object local_120;
  Am_Object local_118;
  Am_Object local_110;
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Formula local_80 [16];
  Am_Formula local_70 [16];
  Am_Formula local_60 [16];
  Am_Formula local_50 [16];
  Am_Formula local_40 [16];
  Am_Value_List local_30 [16];
  
  Am_Initialize();
  Am_Font::Am_Font(local_1f0,Am_FONT_SERIF,true,false,false,Am_FONT_LARGE);
  Am_Object::Create((char *)local_210);
  uVar3 = Am_Object::Set((ushort)local_210,true,0);
  uVar3 = Am_Object::Set(uVar3,true,0);
  uVar3 = Am_Object::Set(uVar3,true,1);
  uVar3 = Am_Object::Set(uVar3,true,1);
  uVar3 = Am_Object::Set(uVar3,0xcd,0xffffff9c);
  Am_Time::Am_Time((Am_Time *)local_220,0x14);
  pAVar5 = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)local_220);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0xe9,(ulong)pAVar5);
  Am_Object::Create((char *)local_200);
  pAVar6 = (Am_Object *)
           Am_Object::Set((ushort)local_200,(Am_Method_Wrapper *)0xc8,
                          (ulong)ball_anim_method.from_wrapper);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim_cmd,pAVar6);
  Am_Object::Am_Object(&local_88,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set_Part(uVar3,(Am_Object)0xc5,(ulong)&local_88);
  Am_Object::operator=(&anim,pAVar6);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(local_200);
  Am_Time::~Am_Time((Am_Time *)local_220);
  Am_Object::~Am_Object(local_210);
  Am_Object::Create((char *)local_220);
  uVar3 = Am_Object::Set((ushort)local_220,0x65,200);
  uVar3 = Am_Object::Set(uVar3,100,10);
  uVar3 = Am_Object::Set(uVar3,0x66,10);
  uVar3 = Am_Object::Set(uVar3,0x67,0x3c);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  AVar7.data = (Am_Object_Data *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  Am_Object::Create((char *)local_200);
  uVar3 = Am_Object::Set((ushort)local_200,(Am_Method_Wrapper *)0xc8,
                         (ulong)paddle_interim_do.from_wrapper);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,0xca,0);
  Am_Object::Am_Object(&local_90,pAVar6);
  uVar3 = Am_Object::Add_Part(AVar7,SUB81(&local_90,0),1);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_210);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(local_210,0x65,1,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar6 = (Am_Object *)Am_Object::Add(uVar3,(Am_Wrapper *)0xb8,(ulong)pAVar5);
  Am_Object::Am_Object(&local_1e8,pAVar6);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_210);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(local_200);
  Am_Object::~Am_Object(local_220);
  Am_Object::Create((char *)local_220);
  uVar3 = Am_Object::Set((ushort)local_220,true,0);
  uVar3 = Am_Object::Set(uVar3,0x65,200);
  uVar3 = Am_Object::Set(uVar3,100,200);
  uVar3 = Am_Object::Set(uVar3,0x66,0x15);
  uVar3 = Am_Object::Set(uVar3,0x67,0x15);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Yellow);
  AVar7.data = (Am_Object_Data *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(&local_a0,&anim);
  uVar3 = Am_Object::Add_Part(AVar7,SUB81(&local_a0,0),1);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_210);
  uVar9 = Am_Value_List::Add(local_210,0x65,1,1);
  uVar9 = Am_Value_List::Add(uVar9,100,1,1);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar9,0x69,1,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar6 = (Am_Object *)Am_Object::Add(uVar3,(Am_Wrapper *)0xb8,(ulong)pAVar5);
  Am_Object::Am_Object(&local_98,pAVar6);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_210);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(local_220);
  Am_Object::Create((char *)local_220);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_
                      ((Am_Formula *)&Am_Center_X_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set((ushort)local_220,(Am_Constraint *)0x64,(ulong)pAVar10);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_
                      ((Am_Formula *)&Am_Center_Y_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x65,(ulong)pAVar10);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_1f0);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0xac,(ulong)pAVar5);
  uVar3 = Am_Object::Set(uVar3,0x66,100);
  uVar3 = Am_Object::Set(uVar3,0x67,100);
  Am_Object::Create((char *)local_200);
  uVar4 = Am_Object::Set((ushort)local_200,(char *)0x150,0x1060a1);
  pAVar6 = (Am_Object *)
           Am_Object::Set(uVar4,(Am_Method_Wrapper *)0xca,(ulong)start_button_method.from_wrapper);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0xc5,(ulong)pAVar5);
  AVar1 = RUNNING;
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)visible_trigger);
  uVar3 = Am_Object::Add(uVar3,(Am_Constraint *)(ulong)AVar1,(ulong)pAVar10);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_210);
  uVar9 = Am_Value_List::Add(local_210,0x69,1,1);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar9,RUNNING,1,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar6 = (Am_Object *)Am_Object::Add(uVar3,(Am_Wrapper *)0xb8,(ulong)pAVar5);
  Am_Object::Am_Object(&local_a8,pAVar6);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_210);
  Am_Object::~Am_Object(local_200);
  Am_Object::~Am_Object(local_220);
  Am_Object::Create((char *)&local_b0);
  uVar3 = Am_Object::Set((ushort)&local_b0,(char *)0x6c,0x1060b4);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Amulet_Purple);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  uVar3 = Am_Object::Set(uVar3,0x66,600);
  uVar3 = Am_Object::Set(uVar3,0x67,0x1c2);
  uVar3 = Am_Object::Add(uVar3,(uint)PLAYER1_SCORE,0);
  uVar3 = Am_Object::Add(uVar3,(uint)PLAYER2_SCORE,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_210);
  uVar9 = Am_Value_List::Add(local_210,PLAYER1_SCORE,1,1);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar9,PLAYER2_SCORE,1,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  uVar3 = Am_Object::Add(uVar3,(Am_Wrapper *)0xb8,(ulong)pAVar5);
  AVar1 = LABEL1;
  Am_Object::Create((char *)&local_c0);
  uVar4 = Am_Object::Set((ushort)&local_c0,100,10);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  uVar4 = Am_Object::Set(uVar4,(char *)0xab,0x1060c0);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_1f0);
  uVar4 = Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  Am_Object::Am_Object(&local_b8,pAVar6);
  AVar7.data._2_6_ = 0;
  AVar7.data._0_2_ = AVar1;
  uVar3 = Am_Object::Add_Part(uVar3,AVar7,(ulong)&local_b8);
  AVar2 = SCORE1;
  Am_Object::Create((char *)&local_d0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar4 = Am_Object::Set((ushort)&local_d0,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)right_of_label1);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x64,(ulong)pAVar10);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  AVar1 = SCORE;
  Am_From_Owner((ushort)local_220);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)local_220);
  uVar4 = Am_Object::Add(uVar4,(Am_Constraint *)(ulong)AVar1,(ulong)pAVar10);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)score_as_string);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0xab,(ulong)pAVar10);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_1f0);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  Am_Object::Am_Object(&local_c8,pAVar6);
  AVar11.data._2_6_ = 0;
  AVar11.data._0_2_ = AVar2;
  uVar3 = Am_Object::Add_Part(uVar3,AVar11,(ulong)&local_c8);
  uVar3 = Am_Object::Set(uVar3,0xa0,10);
  AVar2 = SCORE2;
  Am_Object::Create((char *)&local_e0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar4 = Am_Object::Set((ushort)&local_e0,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Right_Is_Right_Of_Owner);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x64,(ulong)pAVar10);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  AVar1 = SCORE;
  Am_From_Owner((ushort)local_200);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)local_200);
  uVar4 = Am_Object::Add(uVar4,(Am_Constraint *)(ulong)AVar1,(ulong)pAVar10);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)score_as_string);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0xab,(ulong)pAVar10);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_1f0);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  Am_Object::Am_Object(&local_d8,pAVar6);
  AVar12.data._2_6_ = 0;
  AVar12.data._0_2_ = AVar2;
  uVar3 = Am_Object::Add_Part(uVar3,AVar12,(ulong)&local_d8);
  AVar1 = LABEL2;
  Am_Object::Create((char *)&local_f0);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)left_of_score2);
  uVar4 = Am_Object::Set((ushort)&local_f0,(Am_Constraint *)0x64,(ulong)pAVar10);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  uVar4 = Am_Object::Set(uVar4,(char *)0xab,0x1060c0);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_1f0);
  uVar4 = Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  Am_Object::Am_Object(&local_e8,pAVar6);
  AVar13.data._2_6_ = 0;
  AVar13.data._0_2_ = AVar1;
  AVar7.data = (Am_Object_Data *)Am_Object::Add_Part(uVar3,AVar13,(ulong)&local_e8);
  Am_Object::Create((char *)&local_100);
  uVar3 = Am_Object::Set((ushort)&local_100,0x65,10);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_
                      ((Am_Formula *)&Am_Center_X_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,(ulong)pAVar10);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Horizontal_Layout);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x94,(ulong)pAVar10);
  uVar3 = Am_Object::Set(uVar3,0x95,10);
  uVar3 = Am_Object::Set(uVar3,true,0);
  Am_Value_List::Am_Value_List(local_30);
  Am_Object::Create((char *)&local_108);
  uVar4 = Am_Object::Set((ushort)&local_108,(char *)0x150,0x1060e6);
  pAVar6 = (Am_Object *)
           Am_Object::Set(uVar4,(Am_Method_Wrapper *)0xca,(ulong)new_game_method.from_wrapper);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  uVar9 = Am_Value_List::Add(local_30,pAVar5,1,1);
  Am_Object::Create((char *)&local_110);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_110);
  uVar9 = Am_Value_List::Add(uVar9,pAVar5,1,1);
  Am_Object::Create((char *)&local_118);
  uVar4 = Am_Object::Set((ushort)&local_118,(char *)0x150,0x1060fc);
  pAVar6 = (Am_Object *)
           Am_Object::Set(uVar4,(Am_Method_Wrapper *)0xca,
                          (ulong)connect_to_remote_method.from_wrapper);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar9,pAVar5,1,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0xa2,(ulong)pAVar5);
  Am_Object::Am_Object(&local_f8,pAVar6);
  AVar7.data = (Am_Object_Data *)Am_Object::Add_Part(AVar7,SUB81(&local_f8,0),1);
  Am_Object::Create((char *)&local_128);
  uVar3 = Am_Object::Set((ushort)&local_128,100,0);
  uVar3 = Am_Object::Set(uVar3,0x65,0x32);
  Am_From_Owner((ushort)local_40);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_(local_40);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x66,(ulong)pAVar10);
  Am_From_Owner((ushort)local_50,0x67,1.0);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_(local_50);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar10);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(&local_120,pAVar6);
  AVar7.data = (Am_Object_Data *)Am_Object::Add_Part(AVar7,SUB81(&local_120,0),1);
  Am_Object::Create((char *)&local_138);
  uVar3 = Am_Object::Set((ushort)&local_138,100,0);
  uVar3 = Am_Object::Set(uVar3,0x65,0x32);
  Am_From_Owner((ushort)local_60);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_(local_60);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x66,(ulong)pAVar10);
  Am_From_Owner((ushort)local_70,0x67,1.0);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_(local_70);
  AVar11.data = (Am_Object_Data *)Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar10);
  Am_Object::Create((char *)&local_148);
  uVar3 = Am_Object::Set((ushort)&local_148,0x65,0);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_
                      ((Am_Formula *)&Am_Center_X_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,(ulong)pAVar10);
  uVar3 = Am_Object::Set(uVar3,0x66,3);
  Am_From_Owner((ushort)local_80);
  pAVar10 = Am_Formula::operator_cast_to_Am_Constraint_(local_80);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar10);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(&local_140,pAVar6);
  AVar11.data = (Am_Object_Data *)Am_Object::Add_Part(AVar11,SUB81(&local_140,0),1);
  Am_Object::Create((char *)&local_158);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  pAVar6 = (Am_Object *)Am_Object::Set((ushort)&local_158,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  pAVar6 = (Am_Object *)Am_Object::operator=(&paddle1,pAVar6);
  Am_Object::Am_Object(&local_150,pAVar6);
  uVar3 = Am_Object::Add_Part(AVar11,SUB81(&local_150,0),1);
  AVar11.data = (Am_Object_Data *)Am_Object::Set(uVar3,0xa0,10);
  Am_Object::Create((char *)&local_168);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar3 = Am_Object::Set((ushort)&local_168,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,100,0x24e);
  pAVar6 = (Am_Object *)Am_Object::operator=(&paddle2,pAVar6);
  Am_Object::Am_Object(&local_160,pAVar6);
  AVar11.data = (Am_Object_Data *)Am_Object::Add_Part(AVar11,SUB81(&local_160,0),1);
  Am_Object::Create((char *)&local_178);
  pAVar6 = (Am_Object *)Am_Object::operator=(&ball,&local_178);
  Am_Object::Am_Object(&local_170,pAVar6);
  AVar11.data = (Am_Object_Data *)Am_Object::Add_Part(AVar11,SUB81(&local_170,0),1);
  Am_Object::Create((char *)&local_188);
  pAVar6 = (Am_Object *)Am_Object::operator=(&start_button,&local_188);
  Am_Object::Am_Object(&local_180,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(AVar11,SUB81(&local_180,0),1);
  pAVar6 = (Am_Object *)Am_Object::operator=(&main_group,pAVar6);
  Am_Object::Am_Object(&local_130,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(AVar7,SUB81(&local_130,0),1);
  Am_Object::operator=(&window,pAVar6);
  Am_Object::~Am_Object(&local_130);
  Am_Object::~Am_Object(&local_180);
  Am_Object::~Am_Object(&local_188);
  Am_Object::~Am_Object(&local_170);
  Am_Object::~Am_Object(&local_178);
  Am_Object::~Am_Object(&local_160);
  Am_Object::~Am_Object(&local_168);
  Am_Object::~Am_Object(&local_150);
  Am_Object::~Am_Object(&local_158);
  Am_Object::~Am_Object(&local_140);
  Am_Formula::~Am_Formula(local_80);
  Am_Object::~Am_Object(&local_148);
  Am_Formula::~Am_Formula(local_70);
  Am_Formula::~Am_Formula(local_60);
  Am_Object::~Am_Object(&local_138);
  Am_Object::~Am_Object(&local_120);
  Am_Formula::~Am_Formula(local_50);
  Am_Formula::~Am_Formula(local_40);
  Am_Object::~Am_Object(&local_128);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_118);
  Am_Object::~Am_Object(&local_110);
  Am_Object::~Am_Object(&local_108);
  Am_Value_List::~Am_Value_List(local_30);
  Am_Object::~Am_Object(&local_100);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&local_d8);
  Am_Formula::~Am_Formula((Am_Formula *)local_200);
  Am_Object::~Am_Object(&local_e0);
  Am_Object::~Am_Object(&local_c8);
  Am_Formula::~Am_Formula((Am_Formula *)local_220);
  Am_Object::~Am_Object(&local_d0);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_c0);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_210);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::Am_Object(&local_190,&window);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_190,0),1);
  Am_Object::~Am_Object(&local_190);
  Am_Object::Am_Object(&local_198,&paddle1);
  Am_String::Am_String(local_1a0,"net_paddle1",true);
  Am_Network_Group::Link(&Am_Network,&local_198,local_1a0);
  Am_String::~Am_String(local_1a0);
  Am_Object::~Am_Object(&local_198);
  Am_Object::Am_Object(&local_1a8,&paddle2);
  Am_String::Am_String(local_1b0,"net_paddle2",true);
  Am_Network_Group::Link(&Am_Network,&local_1a8,local_1b0);
  Am_String::~Am_String(local_1b0);
  Am_Object::~Am_Object(&local_1a8);
  Am_Object::Am_Object(&local_1b8,&ball);
  Am_String::Am_String(local_1c0,"net_ball",true);
  Am_Network_Group::Link(&Am_Network,&local_1b8,local_1c0);
  Am_String::~Am_String(local_1c0);
  Am_Object::~Am_Object(&local_1b8);
  Am_Object::Am_Object(&local_1c8,&start_button);
  Am_String::Am_String(local_1d0,"net_start",true);
  Am_Network_Group::Link(&Am_Network,&local_1c8,local_1d0);
  Am_String::~Am_String(local_1d0);
  Am_Object::~Am_Object(&local_1c8);
  Am_Object::Am_Object(&local_1d8,&window);
  Am_String::Am_String(local_1e0,"net_score_keeper",true);
  Am_Network_Group::Link(&Am_Network,&local_1d8,local_1e0);
  Am_String::~Am_String(local_1e0);
  Am_Object::~Am_Object(&local_1d8);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_1e8);
  Am_Font::~Am_Font(local_1f0);
  return 0;
}

Assistant:

int
main()
{
  Am_Initialize();
  Am_Font bigfont(Am_FONT_SERIF, true, false, false, Am_FONT_LARGE);
  anim =
      Am_Animation_Interactor.Create("anim")
          .Set(Am_START_WHEN, false)
          .Set(Am_STOP_WHEN, false)
          .Set(Am_START_WHERE_TEST, true)
          .Set(Am_RUN_ALSO, true)
          .Set(Am_PRIORITY, -100)            //let other interactors run
          .Set(Am_REPEAT_DELAY, Am_Time(20)) //milliseconds between increments
          .Set_Part(Am_COMMAND,
                    anim_cmd =
                        Am_Animation_Command.Create("anim_cmd")
                            .Set(Am_INTERIM_DO_METHOD, ball_anim_method));

  Am_Object paddle_proto =
      Am_Rectangle.Create()
          .Set(Am_TOP, 200)
          .Set(Am_LEFT, 10)
          .Set(Am_WIDTH, paddle_width)
          .Set(Am_HEIGHT, paddle_height)
          .Set(Am_LINE_STYLE, Am_No_Style)
          .Add_Part(Am_Move_Grow_Interactor.Create("paddle1move")
                        .Set(Am_INTERIM_DO_METHOD, paddle_interim_do)
                        .Set(Am_DO_METHOD, 0L))
          .Add(Am_SLOTS_TO_SAVE, Am_Value_List().Add(Am_TOP));

  Am_Object ball_proto =
      Am_Arc.Create()
          .Set(Am_VISIBLE, false)
          .Set(Am_TOP, 200)
          .Set(Am_LEFT, 200)
          .Set(Am_WIDTH, ball_size)
          .Set(Am_HEIGHT, ball_size)
          .Set(Am_LINE_STYLE, Am_No_Style)
          .Set(Am_FILL_STYLE, Am_Yellow)
          .Add_Part(anim)
          .Add(Am_SLOTS_TO_SAVE,
               Am_Value_List().Add(Am_TOP).Add(Am_LEFT).Add(Am_VISIBLE));

  Am_Object start_button_proto =
      Am_Button.Create()
          .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
          .Set(Am_TOP, Am_Center_Y_Is_Center_Of_Owner)
          .Set(Am_FONT, bigfont)
          .Set(Am_WIDTH, 100)
          .Set(Am_HEIGHT, 100)
          .Set(Am_COMMAND, Am_Command.Create()
                               .Set(Am_LABEL, "Start!")
                               .Set(Am_DO_METHOD, start_button_method))
          .Add(RUNNING, visible_trigger)
          .Add(Am_SLOTS_TO_SAVE, Am_Value_List().Add(Am_VISIBLE).Add(RUNNING));

  window =
      Am_Window.Create("Main_Window")
          .Set(Am_TITLE, "Amulet PONG")
          .Set(Am_FILL_STYLE, Am_Amulet_Purple)
          .Set(Am_WIDTH, 600)
          .Set(Am_HEIGHT, 450)
          .Add(PLAYER1_SCORE, 0)
          .Add(PLAYER2_SCORE, 0)
          .Add(Am_SLOTS_TO_SAVE,
               Am_Value_List().Add(PLAYER1_SCORE).Add(PLAYER2_SCORE))
          .Add_Part(LABEL1, Am_Text.Create("label1")
                                .Set(Am_LEFT, 10)
                                .Set(Am_TOP, score_top)
                                .Set(Am_TEXT, "Score:")
                                .Set(Am_FONT, bigfont)
                                .Set(Am_LINE_STYLE, Am_Red))
          .Add_Part(SCORE1, Am_Text.Create("score1")
                                .Set(Am_LINE_STYLE, Am_Red)
                                .Set(Am_LEFT, right_of_label1)
                                .Set(Am_TOP, score_top)
                                .Add(SCORE, Am_From_Owner(PLAYER1_SCORE))
                                .Set(Am_TEXT, score_as_string)
                                .Set(Am_FONT, bigfont))
          .Set(Am_RIGHT_OFFSET, 10)
          .Add_Part(SCORE2, Am_Text.Create("score2")
                                .Set(Am_LINE_STYLE, Am_Blue)
                                .Set(Am_LEFT, Am_Right_Is_Right_Of_Owner)
                                .Set(Am_TOP, score_top)
                                .Add(SCORE, Am_From_Owner(PLAYER2_SCORE))
                                .Set(Am_TEXT, score_as_string)
                                .Set(Am_FONT, bigfont))
          .Add_Part(LABEL2, Am_Text.Create("label2")
                                .Set(Am_LEFT, left_of_score2)
                                .Set(Am_TOP, score_top)
                                .Set(Am_TEXT, "Score:")
                                .Set(Am_FONT, bigfont)
                                .Set(Am_LINE_STYLE, Am_Blue))
          .Add_Part(
              Am_Button_Panel.Create("buttons")
                  .Set(Am_TOP, score_top - 2)
                  .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                  .Set(Am_LAYOUT, Am_Horizontal_Layout)
                  .Set(Am_H_SPACING, 10)
                  .Set(Am_FIXED_WIDTH, false)
                  .Set(Am_ITEMS,
                       Am_Value_List()
                           .Add(Am_Command.Create("new game")
                                    .Set(Am_LABEL, "New Game")
                                    .Set(Am_DO_METHOD, new_game_method))
                           .Add(Am_Quit_No_Ask_Command.Create())
                           .Add(Am_Command.Create("connect user")
                                    .Set(Am_LABEL, "Connect to Remote User")
                                    .Set(Am_DO_METHOD,
                                         connect_to_remote_method))))
          .Add_Part(Am_Border_Rectangle.Create()
                        .Set(Am_LEFT, 0)
                        .Set(Am_TOP, top_height)
                        .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                        .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT, -top_height))
                        .Set(Am_FILL_STYLE, Am_Black))
          .Add_Part(
              main_group =
                  Am_Group.Create("main group")
                      .Set(Am_LEFT, 0)
                      .Set(Am_TOP, top_height)
                      .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                      .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT, -top_height))
                      .Add_Part(
                          Am_Rectangle.Create("center")
                              .Set(Am_TOP, 0)
                              .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                              .Set(Am_WIDTH, 3)
                              .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT))
                              .Set(Am_LINE_STYLE, Am_No_Style)
                              .Set(Am_FILL_STYLE, Am_White))
                      .Add_Part(paddle1 = paddle_proto.Create().Set(
                                    Am_FILL_STYLE, Am_Red))
                      .Set(Am_RIGHT_OFFSET, 10)
                      .Add_Part(paddle2 = paddle_proto.Create()
                                              .Set(Am_FILL_STYLE, Am_Blue)
                                              .Set(Am_LEFT, 590))
                      .Add_Part(ball = ball_proto.Create())

                      .Add_Part(start_button = start_button_proto.Create()))

      ;
  Am_Screen.Add_Part(window);

  Am_Network.Link(paddle1, "net_paddle1");
  Am_Network.Link(paddle2, "net_paddle2");
  Am_Network.Link(ball, "net_ball");
  Am_Network.Link(start_button, "net_start");
  Am_Network.Link(window, "net_score_keeper");

  Am_Main_Event_Loop();
  Am_Cleanup();
  return 0;
}